

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.h
# Opt level: O3

void __thiscall
icu_63::UnicodeSet::exclusiveOr(UnicodeSet *this,UChar32 *other,int32_t otherLen,int8_t polarity)

{
  int *piVar1;
  int32_t iVar2;
  UChar32 *pUVar3;
  UChar32 *pUVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  UChar32 UVar8;
  long lVar9;
  int iVar10;
  bool bVar11;
  UErrorCode status;
  undefined8 uStack_28;
  
  if ((this->stringSpan != (UnicodeSetStringSpan *)0x0 || this->bmpSet != (BMPSet *)0x0) ||
     ((this->fFlags & 1) != 0)) {
    return;
  }
  uStack_28 = 0;
  ensureBufferCapacity(this,otherLen + this->len,(UErrorCode *)((long)&uStack_28 + 4));
  if (0 < uStack_28._4_4_) {
    return;
  }
  pUVar3 = this->list;
  iVar7 = *other;
  uVar5 = 1;
  if ((byte)(polarity - 1U) < 2) {
    uVar6 = 0;
    bVar11 = iVar7 != 0;
    iVar7 = 0;
    if (bVar11) goto LAB_001a0e64;
    iVar7 = other[1];
  }
  uVar6 = 1;
LAB_001a0e64:
  UVar8 = *pUVar3;
  pUVar4 = this->buffer;
  iVar10 = 0;
  do {
    uVar6 = (ulong)(int)uVar6;
    lVar9 = (long)iVar10;
    while (iVar10 = (int)lVar9, iVar7 <= UVar8) {
      if (UVar8 <= iVar7) {
        if (UVar8 == 0x110000) {
          pUVar4[lVar9] = 0x110000;
          this->len = iVar10 + 1;
          this->list = pUVar4;
          this->buffer = pUVar3;
          iVar2 = this->capacity;
          this->capacity = this->bufferCapacity;
          this->bufferCapacity = iVar2;
          if (this->pat == (char16_t *)0x0) {
            return;
          }
          uprv_free_63(this->pat);
          this->pat = (char16_t *)0x0;
          this->patLen = 0;
          return;
        }
        iVar7 = other[uVar6];
        uVar6 = (ulong)((int)uVar6 + 1);
        goto LAB_001a0ea7;
      }
      pUVar4[lVar9] = iVar7;
      piVar1 = other + uVar6;
      uVar6 = uVar6 + 1;
      lVar9 = lVar9 + 1;
      iVar7 = *piVar1;
    }
    iVar10 = iVar10 + 1;
    pUVar4[lVar9] = UVar8;
LAB_001a0ea7:
    UVar8 = pUVar3[uVar5];
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

inline UBool UnicodeSet::isFrozen() const {
    return (UBool)(bmpSet!=NULL || stringSpan!=NULL);
}